

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O2

int __thiscall
embree::BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
          (BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  
  fVar16 = *(float *)(ctx + 0xd0);
  fVar17 = *(float *)(ctx + 0xd4);
  fVar18 = *(float *)(ctx + 0xd8);
  fVar19 = *(float *)(ctx + 0xdc);
  this->v[1][1].field_0.m128[0] = fVar16;
  this->v[1][1].field_0.m128[1] = fVar17;
  this->v[1][1].field_0.m128[2] = fVar18;
  this->v[1][1].field_0.m128[3] = fVar19;
  fVar3 = *(float *)(ctx + 0x410);
  fVar4 = *(float *)(ctx + 0x414);
  fVar5 = *(float *)(ctx + 0x418);
  fVar6 = *(float *)(ctx + 0x41c);
  this->v[1][2].field_0.m128[0] = fVar3;
  this->v[1][2].field_0.m128[1] = fVar4;
  this->v[1][2].field_0.m128[2] = fVar5;
  this->v[1][2].field_0.m128[3] = fVar6;
  fVar7 = *(float *)(ctx + 0x750);
  fVar8 = *(float *)(ctx + 0x754);
  fVar9 = *(float *)(ctx + 0x758);
  fVar10 = *(float *)(ctx + 0x75c);
  this->v[2][2].field_0.m128[0] = fVar7;
  this->v[2][2].field_0.m128[1] = fVar8;
  this->v[2][2].field_0.m128[2] = fVar9;
  this->v[2][2].field_0.m128[3] = fVar10;
  fVar11 = *(float *)(ctx + 0xa90);
  fVar12 = *(float *)(ctx + 0xa94);
  fVar13 = *(float *)(ctx + 0xa98);
  fVar14 = *(float *)(ctx + 0xa9c);
  this->v[2][1].field_0.m128[0] = fVar11;
  this->v[2][1].field_0.m128[1] = fVar12;
  this->v[2][1].field_0.m128[2] = fVar13;
  this->v[2][1].field_0.m128[3] = fVar14;
  if ((ulong)*(uint *)(ctx + 8) - 2 == (long)*(int *)ctx) {
    fVar32 = (fVar16 + fVar16) - fVar11;
    fVar33 = (fVar17 + fVar17) - fVar12;
    fVar34 = (fVar18 + fVar18) - fVar13;
    fVar35 = (fVar19 + fVar19) - fVar14;
    this->v[0][1].field_0.m128[0] = fVar32;
    this->v[0][1].field_0.m128[1] = fVar33;
    this->v[0][1].field_0.m128[2] = fVar34;
    this->v[0][1].field_0.m128[3] = fVar35;
    fVar48 = (fVar3 + fVar3) - fVar7;
    fVar49 = (fVar4 + fVar4) - fVar8;
    fVar50 = (fVar5 + fVar5) - fVar9;
    fVar51 = (fVar6 + fVar6) - fVar10;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x300) + -0x20 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar32 = *pfVar1;
    fVar33 = pfVar1[1];
    fVar34 = pfVar1[2];
    fVar35 = pfVar1[3];
    this->v[0][1].field_0.m128[0] = fVar32;
    this->v[0][1].field_0.m128[1] = fVar33;
    this->v[0][1].field_0.m128[2] = fVar34;
    this->v[0][1].field_0.m128[3] = fVar35;
    pfVar1 = (float *)(*(long *)(ctx + 0x300) + -0x10 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar48 = *pfVar1;
    fVar49 = pfVar1[1];
    fVar50 = pfVar1[2];
    fVar51 = pfVar1[3];
  }
  this->v[0][2].field_0.m128[0] = fVar48;
  this->v[0][2].field_0.m128[1] = fVar49;
  this->v[0][2].field_0.m128[2] = fVar50;
  this->v[0][2].field_0.m128[3] = fVar51;
  if ((ulong)*(uint *)(ctx + 0x348) - 2 == (long)*(int *)(ctx + 0x340)) {
    fVar41 = (fVar3 + fVar3) - fVar16;
    fVar43 = (fVar4 + fVar4) - fVar17;
    fVar45 = (fVar5 + fVar5) - fVar18;
    fVar47 = (fVar6 + fVar6) - fVar19;
    this->v[1][3].field_0.m128[0] = fVar41;
    this->v[1][3].field_0.m128[1] = fVar43;
    this->v[1][3].field_0.m128[2] = fVar45;
    this->v[1][3].field_0.m128[3] = fVar47;
    fVar40 = (fVar7 + fVar7) - fVar11;
    fVar42 = (fVar8 + fVar8) - fVar12;
    fVar44 = (fVar9 + fVar9) - fVar13;
    fVar46 = (fVar10 + fVar10) - fVar14;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x640) + -0x20 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar41 = *pfVar1;
    fVar43 = pfVar1[1];
    fVar45 = pfVar1[2];
    fVar47 = pfVar1[3];
    this->v[1][3].field_0.m128[0] = fVar41;
    this->v[1][3].field_0.m128[1] = fVar43;
    this->v[1][3].field_0.m128[2] = fVar45;
    this->v[1][3].field_0.m128[3] = fVar47;
    pfVar1 = (float *)(*(long *)(ctx + 0x640) + -0x10 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar40 = *pfVar1;
    fVar42 = pfVar1[1];
    fVar44 = pfVar1[2];
    fVar46 = pfVar1[3];
  }
  this->v[2][3].field_0.m128[0] = fVar40;
  this->v[2][3].field_0.m128[1] = fVar42;
  this->v[2][3].field_0.m128[2] = fVar44;
  this->v[2][3].field_0.m128[3] = fVar46;
  if ((ulong)*(uint *)(ctx + 0x688) - 2 == (long)*(int *)(ctx + 0x680)) {
    fVar20 = (fVar7 + fVar7) - fVar3;
    fVar21 = (fVar8 + fVar8) - fVar4;
    fVar22 = (fVar9 + fVar9) - fVar5;
    fVar23 = (fVar10 + fVar10) - fVar6;
    this->v[3][2].field_0.m128[0] = fVar20;
    this->v[3][2].field_0.m128[1] = fVar21;
    this->v[3][2].field_0.m128[2] = fVar22;
    this->v[3][2].field_0.m128[3] = fVar23;
    fVar36 = (fVar11 + fVar11) - fVar16;
    fVar37 = (fVar12 + fVar12) - fVar17;
    fVar38 = (fVar13 + fVar13) - fVar18;
    fVar39 = (fVar14 + fVar14) - fVar19;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x980) + -0x20 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar20 = *pfVar1;
    fVar21 = pfVar1[1];
    fVar22 = pfVar1[2];
    fVar23 = pfVar1[3];
    this->v[3][2].field_0.m128[0] = fVar20;
    this->v[3][2].field_0.m128[1] = fVar21;
    this->v[3][2].field_0.m128[2] = fVar22;
    this->v[3][2].field_0.m128[3] = fVar23;
    pfVar1 = (float *)(*(long *)(ctx + 0x980) + -0x10 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar36 = *pfVar1;
    fVar37 = pfVar1[1];
    fVar38 = pfVar1[2];
    fVar39 = pfVar1[3];
  }
  this->v[3][1].field_0.m128[0] = fVar36;
  this->v[3][1].field_0.m128[1] = fVar37;
  this->v[3][1].field_0.m128[2] = fVar38;
  this->v[3][1].field_0.m128[3] = fVar39;
  if ((ulong)*(uint *)(ctx + 0x9c8) - 2 == (long)*(int *)(ctx + 0x9c0)) {
    fVar24 = (fVar11 + fVar11) - fVar7;
    fVar26 = (fVar12 + fVar12) - fVar8;
    fVar28 = (fVar13 + fVar13) - fVar9;
    fVar30 = (fVar14 + fVar14) - fVar10;
    this->v[2][0].field_0.m128[0] = fVar24;
    this->v[2][0].field_0.m128[1] = fVar26;
    this->v[2][0].field_0.m128[2] = fVar28;
    this->v[2][0].field_0.m128[3] = fVar30;
    fVar25 = (fVar16 + fVar16) - fVar3;
    fVar27 = (fVar17 + fVar17) - fVar4;
    fVar29 = (fVar18 + fVar18) - fVar5;
    fVar31 = (fVar19 + fVar19) - fVar6;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0xcc0) + -0x20 + (ulong)*(uint *)(ctx + 0x9c8) * 0x10);
    fVar24 = *pfVar1;
    fVar26 = pfVar1[1];
    fVar28 = pfVar1[2];
    fVar30 = pfVar1[3];
    this->v[2][0].field_0.m128[0] = fVar24;
    this->v[2][0].field_0.m128[1] = fVar26;
    this->v[2][0].field_0.m128[2] = fVar28;
    this->v[2][0].field_0.m128[3] = fVar30;
    pfVar1 = (float *)(*(long *)(ctx + 0xcc0) + -0x10 + (ulong)*(uint *)(ctx + 0x9c8) * 0x10);
    fVar25 = *pfVar1;
    fVar27 = pfVar1[1];
    fVar29 = pfVar1[2];
    fVar31 = pfVar1[3];
  }
  this->v[1][0].field_0.m128[0] = fVar25;
  this->v[1][0].field_0.m128[1] = fVar27;
  this->v[1][0].field_0.m128[2] = fVar29;
  this->v[1][0].field_0.m128[3] = fVar31;
  iVar2 = *(int *)ctx;
  if ((ulong)*(uint *)(ctx + 8) - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      fVar52 = fVar3 + fVar11;
      fVar53 = fVar4 + fVar12;
      fVar54 = fVar5 + fVar13;
      fVar55 = fVar6 + fVar14;
      if ((*(uint *)(ctx + 0xc) & 0x7fffffff) == 0x7f800000) {
        fVar52 = fVar16 * 4.0 - (fVar52 + fVar52);
        fVar53 = fVar17 * 4.0 - (fVar53 + fVar53);
        fVar54 = fVar18 * 4.0 - (fVar54 + fVar54);
        fVar55 = fVar19 * 4.0 - (fVar55 + fVar55);
      }
      else {
        fVar52 = fVar52 * 4.0 + fVar16 * -8.0;
        fVar53 = fVar53 * 4.0 + fVar17 * -8.0;
        fVar54 = fVar54 * 4.0 + fVar18 * -8.0;
        fVar55 = fVar55 * 4.0 + fVar19 * -8.0;
      }
      fVar52 = fVar52 + fVar7;
      fVar53 = fVar53 + fVar8;
      fVar54 = fVar54 + fVar9;
      fVar55 = fVar55 + fVar10;
    }
    else {
      fVar52 = (fVar25 + fVar25) - fVar24;
      fVar53 = (fVar27 + fVar27) - fVar26;
      fVar54 = (fVar29 + fVar29) - fVar28;
      fVar55 = (fVar31 + fVar31) - fVar30;
    }
  }
  else if (iVar2 == 2) {
    fVar52 = (fVar32 + fVar32) - fVar48;
    fVar53 = (fVar33 + fVar33) - fVar49;
    fVar54 = (fVar34 + fVar34) - fVar50;
    fVar55 = (fVar35 + fVar35) - fVar51;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x300) + -0x30 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar52 = *pfVar1;
    fVar53 = pfVar1[1];
    fVar54 = pfVar1[2];
    fVar55 = pfVar1[3];
  }
  this->v[0][0].field_0.m128[0] = fVar52;
  this->v[0][0].field_0.m128[1] = fVar53;
  this->v[0][0].field_0.m128[2] = fVar54;
  this->v[0][0].field_0.m128[3] = fVar55;
  iVar2 = *(int *)(ctx + 0x340);
  if ((ulong)*(uint *)(ctx + 0x348) - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      fVar32 = fVar16 + fVar7;
      fVar33 = fVar17 + fVar8;
      fVar34 = fVar18 + fVar9;
      fVar35 = fVar19 + fVar10;
      if ((*(uint *)(ctx + 0x34c) & 0x7fffffff) == 0x7f800000) {
        fVar32 = fVar3 * 4.0 - (fVar32 + fVar32);
        fVar33 = fVar4 * 4.0 - (fVar33 + fVar33);
        fVar34 = fVar5 * 4.0 - (fVar34 + fVar34);
        fVar35 = fVar6 * 4.0 - (fVar35 + fVar35);
      }
      else {
        fVar32 = fVar32 * 4.0 + fVar3 * -8.0;
        fVar33 = fVar33 * 4.0 + fVar4 * -8.0;
        fVar34 = fVar34 * 4.0 + fVar5 * -8.0;
        fVar35 = fVar35 * 4.0 + fVar6 * -8.0;
      }
      fVar32 = fVar32 + fVar11;
      fVar33 = fVar33 + fVar12;
      fVar34 = fVar34 + fVar13;
      fVar35 = fVar35 + fVar14;
    }
    else {
      fVar32 = (fVar48 + fVar48) - fVar32;
      fVar33 = (fVar49 + fVar49) - fVar33;
      fVar34 = (fVar50 + fVar50) - fVar34;
      fVar35 = (fVar51 + fVar51) - fVar35;
    }
  }
  else if (iVar2 == 2) {
    fVar32 = (fVar41 + fVar41) - fVar40;
    fVar33 = (fVar43 + fVar43) - fVar42;
    fVar34 = (fVar45 + fVar45) - fVar44;
    fVar35 = (fVar47 + fVar47) - fVar46;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x640) + -0x30 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar32 = *pfVar1;
    fVar33 = pfVar1[1];
    fVar34 = pfVar1[2];
    fVar35 = pfVar1[3];
  }
  this->v[0][3].field_0.m128[0] = fVar32;
  this->v[0][3].field_0.m128[1] = fVar33;
  this->v[0][3].field_0.m128[2] = fVar34;
  this->v[0][3].field_0.m128[3] = fVar35;
  iVar2 = *(int *)(ctx + 0x680);
  if ((ulong)*(uint *)(ctx + 0x688) - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      fVar32 = fVar3 + fVar11;
      fVar33 = fVar4 + fVar12;
      fVar34 = fVar5 + fVar13;
      fVar35 = fVar6 + fVar14;
      if ((*(uint *)(ctx + 0x68c) & 0x7fffffff) == 0x7f800000) {
        fVar41 = fVar7 * 4.0 - (fVar32 + fVar32);
        fVar43 = fVar8 * 4.0 - (fVar33 + fVar33);
        fVar45 = fVar9 * 4.0 - (fVar34 + fVar34);
        fVar47 = fVar10 * 4.0 - (fVar35 + fVar35);
      }
      else {
        fVar41 = fVar32 * 4.0 + fVar7 * -8.0;
        fVar43 = fVar33 * 4.0 + fVar8 * -8.0;
        fVar45 = fVar34 * 4.0 + fVar9 * -8.0;
        fVar47 = fVar35 * 4.0 + fVar10 * -8.0;
      }
      fVar41 = fVar41 + fVar16;
      fVar43 = fVar43 + fVar17;
      fVar45 = fVar45 + fVar18;
      fVar47 = fVar47 + fVar19;
    }
    else {
      fVar41 = (fVar40 + fVar40) - fVar41;
      fVar43 = (fVar42 + fVar42) - fVar43;
      fVar45 = (fVar44 + fVar44) - fVar45;
      fVar47 = (fVar46 + fVar46) - fVar47;
    }
  }
  else if (iVar2 == 2) {
    fVar41 = (fVar20 + fVar20) - fVar36;
    fVar43 = (fVar21 + fVar21) - fVar37;
    fVar45 = (fVar22 + fVar22) - fVar38;
    fVar47 = (fVar23 + fVar23) - fVar39;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x980) + -0x30 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar41 = *pfVar1;
    fVar43 = pfVar1[1];
    fVar45 = pfVar1[2];
    fVar47 = pfVar1[3];
  }
  this->v[3][3].field_0.m128[0] = fVar41;
  this->v[3][3].field_0.m128[1] = fVar43;
  this->v[3][3].field_0.m128[2] = fVar45;
  this->v[3][3].field_0.m128[3] = fVar47;
  iVar2 = *(int *)(ctx + 0x9c0);
  uVar15 = (ulong)*(uint *)(ctx + 0x9c8);
  if (uVar15 - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      uVar15 = (ulong)(*(uint *)(ctx + 0x9cc) & 0x7fffffff);
      fVar16 = fVar16 + fVar7;
      fVar17 = fVar17 + fVar8;
      fVar18 = fVar18 + fVar9;
      fVar19 = fVar19 + fVar10;
      if ((*(uint *)(ctx + 0x9cc) & 0x7fffffff) == 0x7f800000) {
        fVar25 = fVar11 * 4.0 - (fVar16 + fVar16);
        fVar27 = fVar12 * 4.0 - (fVar17 + fVar17);
        fVar29 = fVar13 * 4.0 - (fVar18 + fVar18);
        fVar31 = fVar14 * 4.0 - (fVar19 + fVar19);
      }
      else {
        fVar25 = fVar11 * -8.0 + fVar16 * 4.0;
        fVar27 = fVar12 * -8.0 + fVar17 * 4.0;
        fVar29 = fVar13 * -8.0 + fVar18 * 4.0;
        fVar31 = fVar14 * -8.0 + fVar19 * 4.0;
      }
      fVar25 = fVar3 + fVar25;
      fVar27 = fVar4 + fVar27;
      fVar29 = fVar5 + fVar29;
      fVar31 = fVar6 + fVar31;
    }
    else {
      fVar25 = (fVar36 + fVar36) - fVar20;
      fVar27 = (fVar37 + fVar37) - fVar21;
      fVar29 = (fVar38 + fVar38) - fVar22;
      fVar31 = (fVar39 + fVar39) - fVar23;
    }
  }
  else if (iVar2 == 2) {
    fVar25 = (fVar24 + fVar24) - fVar25;
    fVar27 = (fVar26 + fVar26) - fVar27;
    fVar29 = (fVar28 + fVar28) - fVar29;
    fVar31 = (fVar30 + fVar30) - fVar31;
  }
  else {
    uVar15 = uVar15 * 0x10;
    pfVar1 = (float *)(*(long *)(ctx + 0xcc0) + -0x30 + uVar15);
    fVar25 = *pfVar1;
    fVar27 = pfVar1[1];
    fVar29 = pfVar1[2];
    fVar31 = pfVar1[3];
  }
  this->v[3][0].field_0.m128[0] = fVar25;
  this->v[3][0].field_0.m128[1] = fVar27;
  this->v[3][0].field_0.m128[2] = fVar29;
  this->v[3][0].field_0.m128[3] = fVar31;
  return (int)uVar15;
}

Assistant:

__forceinline Vec3fa& operator =( const Vec3fa& other ) { m128 = other.m128; return *this; }